

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
betterThreshold<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *th,Real epsilon)

{
  bool bVar1;
  long lVar2;
  soplex *psVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  uint *puVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  byte bVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_538;
  cpp_dec_float<200U,_int,_void> local_4b8;
  cpp_dec_float<200U,_int,_void> local_438;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined5 uStack_350;
  undefined3 uStack_34b;
  undefined5 uStack_348;
  undefined8 local_340;
  cpp_dec_float<200U,_int,_void> local_338;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined5 uStack_250;
  undefined3 uStack_24b;
  undefined5 uStack_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined5 uStack_1d0;
  undefined3 uStack_1cb;
  undefined5 uStack_1c8;
  undefined8 local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  uint local_b0 [28];
  undefined4 local_40;
  soplex local_3c;
  undefined8 local_38;
  
  bVar7 = 0;
  psVar3 = this;
  puVar5 = local_b0;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar5 = *(uint *)psVar3;
    psVar3 = psVar3 + 4;
    puVar5 = puVar5 + 1;
  }
  local_40 = *(undefined4 *)(this + 0x70);
  local_3c = this[0x74];
  local_38 = *(undefined8 *)(this + 0x78);
  local_1c0 = 0x1c00000000;
  local_238 = 0;
  uStack_230 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  uStack_1cb = 0;
  uStack_1c8 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_238,0.1);
  bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_238,1e-15);
  if (bVar1) {
    local_4b8.fpclass = cpp_dec_float_finite;
    local_4b8.prec_elem = 0x1c;
    local_4b8.data._M_elems[0] = 0;
    local_4b8.data._M_elems[1] = 0;
    local_4b8.data._M_elems[2] = 0;
    local_4b8.data._M_elems[3] = 0;
    local_4b8.data._M_elems[4] = 0;
    local_4b8.data._M_elems[5] = 0;
    local_4b8.data._M_elems[6] = 0;
    local_4b8.data._M_elems[7] = 0;
    local_4b8.data._M_elems[8] = 0;
    local_4b8.data._M_elems[9] = 0;
    local_4b8.data._M_elems[10] = 0;
    local_4b8.data._M_elems[0xb] = 0;
    local_4b8.data._M_elems[0xc] = 0;
    local_4b8.data._M_elems[0xd] = 0;
    local_4b8.data._M_elems[0xe] = 0;
    local_4b8.data._M_elems[0xf] = 0;
    local_4b8.data._M_elems[0x10] = 0;
    local_4b8.data._M_elems[0x11] = 0;
    local_4b8.data._M_elems[0x12] = 0;
    local_4b8.data._M_elems[0x13] = 0;
    local_4b8.data._M_elems[0x14] = 0;
    local_4b8.data._M_elems[0x15] = 0;
    local_4b8.data._M_elems[0x16] = 0;
    local_4b8.data._M_elems[0x17] = 0;
    local_4b8.data._M_elems[0x18] = 0;
    local_4b8.data._M_elems[0x19] = 0;
    local_4b8.data._M_elems._104_5_ = 0;
    local_4b8.data._M_elems[0x1b]._1_3_ = 0;
    local_4b8.exp = 0;
    local_4b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_4b8,10.0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              ((cpp_dec_float<200U,_int,_void> *)this,&local_4b8);
  }
  else {
    psVar3 = this;
    pnVar6 = &local_130;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = *(uint *)psVar3;
      psVar3 = psVar3 + (ulong)bVar7 * -8 + 4;
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = *(int *)(this + 0x70);
    local_130.m_backend.neg = *(bool *)(this + 0x74);
    local_130.m_backend._120_8_ = *(undefined8 *)(this + 0x78);
    local_240 = 0x1c00000000;
    local_2b8 = 0;
    uStack_2b0 = 0;
    local_2a8 = 0;
    uStack_2a0 = 0;
    local_298 = 0;
    uStack_290 = 0;
    local_288 = 0;
    uStack_280 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uStack_24b = 0;
    uStack_248 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_2b8,0.9);
    bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_130,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_2b8,epsilon);
    if (bVar1) {
      local_438.fpclass = cpp_dec_float_finite;
      local_438.prec_elem = 0x1c;
      local_438.data._M_elems[0] = 0;
      local_438.data._M_elems[1] = 0;
      local_438.data._M_elems[2] = 0;
      local_438.data._M_elems[3] = 0;
      local_438.data._M_elems[4] = 0;
      local_438.data._M_elems[5] = 0;
      local_438.data._M_elems[6] = 0;
      local_438.data._M_elems[7] = 0;
      local_438.data._M_elems[8] = 0;
      local_438.data._M_elems[9] = 0;
      local_438.data._M_elems[10] = 0;
      local_438.data._M_elems[0xb] = 0;
      local_438.data._M_elems[0xc] = 0;
      local_438.data._M_elems[0xd] = 0;
      local_438.data._M_elems[0xe] = 0;
      local_438.data._M_elems[0xf] = 0;
      local_438.data._M_elems[0x10] = 0;
      local_438.data._M_elems[0x11] = 0;
      local_438.data._M_elems[0x12] = 0;
      local_438.data._M_elems[0x13] = 0;
      local_438.data._M_elems[0x14] = 0;
      local_438.data._M_elems[0x15] = 0;
      local_438.data._M_elems[0x16] = 0;
      local_438.data._M_elems[0x17] = 0;
      local_438.data._M_elems[0x18] = 0;
      local_438.data._M_elems[0x19] = 0;
      local_438.data._M_elems._104_5_ = 0;
      local_438.data._M_elems[0x1b]._1_3_ = 0;
      local_438.exp = 0;
      local_438.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_438,1.0);
      local_538.fpclass = cpp_dec_float_finite;
      local_538.prec_elem = 0x1c;
      local_538.data._M_elems[0] = 0;
      local_538.data._M_elems[1] = 0;
      local_538.data._M_elems[2] = 0;
      local_538.data._M_elems[3] = 0;
      local_538.data._M_elems[4] = 0;
      local_538.data._M_elems[5] = 0;
      local_538.data._M_elems[6] = 0;
      local_538.data._M_elems[7] = 0;
      local_538.data._M_elems[8] = 0;
      local_538.data._M_elems[9] = 0;
      local_538.data._M_elems[10] = 0;
      local_538.data._M_elems[0xb] = 0;
      local_538.data._M_elems[0xc] = 0;
      local_538.data._M_elems[0xd] = 0;
      local_538.data._M_elems[0xe] = 0;
      local_538.data._M_elems[0xf] = 0;
      local_538.data._M_elems[0x10] = 0;
      local_538.data._M_elems[0x11] = 0;
      local_538.data._M_elems[0x12] = 0;
      local_538.data._M_elems[0x13] = 0;
      local_538.data._M_elems[0x14] = 0;
      local_538.data._M_elems[0x15] = 0;
      local_538.data._M_elems[0x16] = 0;
      local_538.data._M_elems[0x17] = 0;
      local_538.data._M_elems[0x18] = 0;
      local_538.data._M_elems[0x19] = 0;
      local_538.data._M_elems._104_5_ = 0;
      local_538.data._M_elems[0x1b]._1_3_ = 0;
      local_538.exp = 0;
      local_538.neg = false;
      if (&local_538 != (cpp_dec_float<200U,_int,_void> *)this) {
        psVar3 = this;
        pcVar4 = &local_538;
        for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pcVar4->data)._M_elems[0] = *(uint *)psVar3;
          psVar3 = psVar3 + (ulong)bVar7 * -8 + 4;
          pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar7 * -8 + 4);
        }
        local_538.exp = *(int *)(this + 0x70);
        local_538.neg = *(bool *)(this + 0x74);
        local_538._120_8_ = *(undefined8 *)(this + 0x78);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_538,&local_438);
      local_338.fpclass = cpp_dec_float_finite;
      local_338.prec_elem = 0x1c;
      local_338.data._M_elems[0] = 0;
      local_338.data._M_elems[1] = 0;
      local_338.data._M_elems[2] = 0;
      local_338.data._M_elems[3] = 0;
      local_338.data._M_elems[4] = 0;
      local_338.data._M_elems[5] = 0;
      local_338.data._M_elems[6] = 0;
      local_338.data._M_elems[7] = 0;
      local_338.data._M_elems[8] = 0;
      local_338.data._M_elems[9] = 0;
      local_338.data._M_elems[10] = 0;
      local_338.data._M_elems[0xb] = 0;
      local_338.data._M_elems[0xc] = 0;
      local_338.data._M_elems[0xd] = 0;
      local_338.data._M_elems[0xe] = 0;
      local_338.data._M_elems[0xf] = 0;
      local_338.data._M_elems[0x10] = 0;
      local_338.data._M_elems[0x11] = 0;
      local_338.data._M_elems[0x12] = 0;
      local_338.data._M_elems[0x13] = 0;
      local_338.data._M_elems[0x14] = 0;
      local_338.data._M_elems[0x15] = 0;
      local_338.data._M_elems[0x16] = 0;
      local_338.data._M_elems[0x17] = 0;
      local_338.data._M_elems[0x18] = 0;
      local_338.data._M_elems[0x19] = 0;
      local_338.data._M_elems._104_5_ = 0;
      local_338.data._M_elems[0x1b]._1_3_ = 0;
      local_338.exp = 0;
      local_338.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_338,2.0);
      local_4b8.fpclass = cpp_dec_float_finite;
      local_4b8.prec_elem = 0x1c;
      local_4b8.data._M_elems[0] = 0;
      local_4b8.data._M_elems[1] = 0;
      local_4b8.data._M_elems[2] = 0;
      local_4b8.data._M_elems[3] = 0;
      local_4b8.data._M_elems[4] = 0;
      local_4b8.data._M_elems[5] = 0;
      local_4b8.data._M_elems[6] = 0;
      local_4b8.data._M_elems[7] = 0;
      local_4b8.data._M_elems[8] = 0;
      local_4b8.data._M_elems[9] = 0;
      local_4b8.data._M_elems[10] = 0;
      local_4b8.data._M_elems[0xb] = 0;
      local_4b8.data._M_elems[0xc] = 0;
      local_4b8.data._M_elems[0xd] = 0;
      local_4b8.data._M_elems[0xe] = 0;
      local_4b8.data._M_elems[0xf] = 0;
      local_4b8.data._M_elems[0x10] = 0;
      local_4b8.data._M_elems[0x11] = 0;
      local_4b8.data._M_elems[0x12] = 0;
      local_4b8.data._M_elems[0x13] = 0;
      local_4b8.data._M_elems[0x14] = 0;
      local_4b8.data._M_elems[0x15] = 0;
      local_4b8.data._M_elems[0x16] = 0;
      local_4b8.data._M_elems[0x17] = 0;
      local_4b8.data._M_elems[0x18] = 0;
      local_4b8.data._M_elems[0x19] = 0;
      local_4b8.data._M_elems._104_5_ = 0;
      local_4b8.data._M_elems[0x1b]._1_3_ = 0;
      local_4b8.exp = 0;
      local_4b8.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_4b8,&local_538,&local_338);
      pcVar4 = &local_4b8;
      psVar3 = this;
      for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(uint *)psVar3 = (pcVar4->data)._M_elems[0];
        pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar7 * -8 + 4);
        psVar3 = psVar3 + (ulong)bVar7 * -8 + 4;
      }
      *(int *)(this + 0x70) = local_4b8.exp;
      this[0x74] = (soplex)local_4b8.neg;
    }
    else {
      psVar3 = this;
      pnVar6 = &local_1b0;
      for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pnVar6->m_backend).data._M_elems[0] = *(uint *)psVar3;
        psVar3 = psVar3 + (ulong)bVar7 * -8 + 4;
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = *(int *)(this + 0x70);
      local_1b0.m_backend.neg = *(bool *)(this + 0x74);
      local_1b0.m_backend._120_8_ = *(undefined8 *)(this + 0x78);
      local_340 = 0x1c00000000;
      local_3b8 = 0;
      uStack_3b0 = 0;
      local_3a8 = 0;
      uStack_3a0 = 0;
      local_398 = 0;
      uStack_390 = 0;
      local_388 = 0;
      uStack_380 = 0;
      local_378 = 0;
      uStack_370 = 0;
      local_368 = 0;
      uStack_360 = 0;
      local_358 = 0;
      uStack_350 = 0;
      uStack_34b = 0;
      uStack_348 = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_3b8,0.999);
      bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_1b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_3b8,epsilon);
      if (!bVar1) goto LAB_00148a93;
      local_4b8.fpclass = cpp_dec_float_finite;
      local_4b8.prec_elem = 0x1c;
      local_4b8.data._M_elems[0] = 0;
      local_4b8.data._M_elems[1] = 0;
      local_4b8.data._M_elems[2] = 0;
      local_4b8.data._M_elems[3] = 0;
      local_4b8.data._M_elems[4] = 0;
      local_4b8.data._M_elems[5] = 0;
      local_4b8.data._M_elems[6] = 0;
      local_4b8.data._M_elems[7] = 0;
      local_4b8.data._M_elems[8] = 0;
      local_4b8.data._M_elems[9] = 0;
      local_4b8.data._M_elems[10] = 0;
      local_4b8.data._M_elems[0xb] = 0;
      local_4b8.data._M_elems[0xc] = 0;
      local_4b8.data._M_elems[0xd] = 0;
      local_4b8.data._M_elems[0xe] = 0;
      local_4b8.data._M_elems[0xf] = 0;
      local_4b8.data._M_elems[0x10] = 0;
      local_4b8.data._M_elems[0x11] = 0;
      local_4b8.data._M_elems[0x12] = 0;
      local_4b8.data._M_elems[0x13] = 0;
      local_4b8.data._M_elems[0x14] = 0;
      local_4b8.data._M_elems[0x15] = 0;
      local_4b8.data._M_elems[0x16] = 0;
      local_4b8.data._M_elems[0x17] = 0;
      local_4b8.data._M_elems[0x18] = 0;
      local_4b8.data._M_elems[0x19] = 0;
      local_4b8.data._M_elems._104_5_ = 0;
      local_4b8.data._M_elems[0x1b]._1_3_ = 0;
      local_4b8.exp = 0;
      local_4b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_4b8,0.99999);
      pcVar4 = &local_4b8;
      psVar3 = this;
      for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(uint *)psVar3 = (pcVar4->data)._M_elems[0];
        pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar7 * -8 + 4);
        psVar3 = psVar3 + (ulong)bVar7 * -8 + 4;
      }
      *(int *)(this + 0x70) = local_4b8.exp;
      this[0x74] = (soplex)local_4b8.neg;
    }
    *(undefined8 *)(this + 0x78) = local_4b8._120_8_;
  }
LAB_00148a93:
  psVar3 = this;
  pnVar6 = __return_storage_ptr__;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = *(uint *)psVar3;
    psVar3 = psVar3 + (ulong)bVar7 * -8 + 4;
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  (__return_storage_ptr__->m_backend).exp = *(int *)(this + 0x70);
  (__return_storage_ptr__->m_backend).neg = (bool)this[0x74];
  pnVar6 = *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             **)(this + 0x78);
  *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    **)&(__return_storage_ptr__->m_backend).fpclass = pnVar6;
  return pnVar6;
}

Assistant:

static R betterThreshold(R th, Real epsilon)
{
   assert(th < R(1.0));

   if(LT(th, R(0.1), 1e-15))
      th *= R(10.0);
   else if(LT(th, R(0.9), epsilon))
      th = (th + R(1.0)) / R(2.0);
   else if(LT(th, R(0.999), epsilon))
      th = R(0.99999);

   assert(th < R(1.0));

   return th;
}